

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

AssertionResult __thiscall
testing::internal::EqFailure
          (internal *this,char *expected_expression,char *actual_expression,String *expected_value,
          String *actual_value,bool ignoring_case)

{
  bool bVar1;
  Message *pMVar2;
  AssertionResult *other;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  extraout_RDX;
  AssertionResult AVar3;
  Message msg;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  char *local_48;
  char *local_40;
  AssertionResult local_38;
  
  local_48 = actual_expression;
  local_40 = expected_expression;
  Message::Message((Message *)&local_50);
  pMVar2 = Message::operator<<((Message *)&local_50,(char (*) [11])"Value of: ");
  Message::operator<<(pMVar2,&local_48);
  bVar1 = String::operator!=(actual_value,local_48);
  if (bVar1) {
    pMVar2 = Message::operator<<((Message *)&local_50,(char (*) [12])"\n  Actual: ");
    Message::operator<<(pMVar2,actual_value);
  }
  pMVar2 = Message::operator<<((Message *)&local_50,(char (*) [12])"\nExpected: ");
  Message::operator<<(pMVar2,&local_40);
  if (ignoring_case) {
    Message::operator<<((Message *)&local_50,(char (*) [17])" (ignoring case)");
  }
  bVar1 = String::operator!=(expected_value,local_40);
  if (bVar1) {
    pMVar2 = Message::operator<<((Message *)&local_50,(char (*) [12])"\nWhich is: ");
    Message::operator<<(pMVar2,expected_value);
  }
  local_38.success_ = false;
  local_38.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  other = AssertionResult::operator<<(&local_38,(Message *)&local_50);
  AssertionResult::AssertionResult((AssertionResult *)this,other);
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&local_38.message_);
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_50);
  AVar3.message_.ptr_ = extraout_RDX.ptr_;
  AVar3._0_8_ = this;
  return AVar3;
}

Assistant:

AssertionResult EqFailure(const char* expected_expression,
                          const char* actual_expression,
                          const String& expected_value,
                          const String& actual_value,
                          bool ignoring_case) {
  Message msg;
  msg << "Value of: " << actual_expression;
  if (actual_value != actual_expression) {
    msg << "\n  Actual: " << actual_value;
  }

  msg << "\nExpected: " << expected_expression;
  if (ignoring_case) {
    msg << " (ignoring case)";
  }
  if (expected_value != expected_expression) {
    msg << "\nWhich is: " << expected_value;
  }

  return AssertionFailure() << msg;
}